

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void mov_eAXOv(PDISASM pMyDisasm)

{
  Int64 MyNumber;
  int iVar1;
  ulong uVar2;
  UInt64 MyAddress;
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  strcpy((pMyDisasm->Instruction).Mnemonic,"mov");
  (pMyDisasm->Reserved_).RM_ = 5;
  (pMyDisasm->Reserved_).MOD_ = 0;
  if ((pMyDisasm->Reserved_).AddressSize == 0x40) {
    iVar1 = Security(9,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    MyNumber = *(Int64 *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.16llX",MyNumber);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 9;
    (pMyDisasm->Operand2).Memory.Displacement = MyNumber;
  }
  else if ((pMyDisasm->Reserved_).AddressSize == 0x20) {
    iVar1 = Security(5,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    uVar2 = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.8X",uVar2);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 5;
    (pMyDisasm->Operand2).Memory.Displacement = uVar2;
  }
  else {
    iVar1 = Security(3,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    uVar2 = (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.4X",uVar2);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 3;
    (pMyDisasm->Operand2).Memory.Displacement = uVar2;
  }
  if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 1;
    if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[0]);
    }
    else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[0]);
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x66;
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[0]);
    }
  }
  else {
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 0x100;
    if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[8]);
    }
    else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[8]);
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x66;
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[8]);
    }
  }
  (pMyDisasm->Operand2).OpType = 0x30000;
  if ((pMyDisasm->Reserved_).MemDecoration == 0x68) {
    (pMyDisasm->Operand1).OpSize = 0x40;
    (pMyDisasm->Operand2).OpSize = 0x40;
  }
  else if ((pMyDisasm->Reserved_).MemDecoration == 0x67) {
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand2).OpSize = 0x20;
  }
  else if ((pMyDisasm->Reserved_).MemDecoration == 0x66) {
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand2).OpSize = 0x10;
  }
  return;
}

Assistant:

void __bea_callspec__ mov_eAXOv(PDISASM pMyDisasm)
{
    UInt64 MyAddress;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mov");
    #endif
    GV.RM_ = 5;
    GV.MOD_= 0;
    if (GV.AddressSize == 64) {
        if (!Security(9, pMyDisasm)) return;
        MyAddress = *((UInt64 *) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.16llX",(Int64) MyAddress);
       #endif
       GV.EIP_+=9;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }
    else if (GV.AddressSize == 32) {
        if (!Security(5, pMyDisasm)) return;
        MyAddress = *((UInt32*) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.8X",(Int64) MyAddress);
       #endif
       GV.EIP_+=5;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }
    else {
        if (!Security(3, pMyDisasm)) return;
        MyAddress = *((UInt16*) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.4X",(Int64) MyAddress);
       #endif
       GV.EIP_+=3;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }

    if (GV.REX.B_ == 0) {
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0;
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
            #endif
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
            #endif
        }
        else {
            GV.MemDecoration = Arg2word;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
            #endif
        }
    }
    else {
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG8;
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0+8]);
            #endif
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0+8]);
            #endif
        }
        else {
            GV.MemDecoration = Arg2word;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0+8]);
            #endif
        }
    }

    pMyDisasm->Operand2.OpType = MEMORY_TYPE ;
    if (GV.MemDecoration == 104) {
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Operand2.OpSize = 64;
    }
    else if (GV.MemDecoration == 103) {
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand2.OpSize = 32;
    }
    else if (GV.MemDecoration == 102) {
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand2.OpSize = 16;
    }

}